

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int DoSegmentsJob(void *arg1,void *arg2)

{
  int iVar1;
  VP8EncIterator *in_RSI;
  bool bVar2;
  uint8_t *scratch;
  uint8_t tmp [63];
  int ok;
  VP8EncIterator *it;
  SegmentJob *job;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  VP8EncIterator *in_stack_ffffffffffffffa8;
  VP8EncIterator *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffc8;
  VP8EncIterator *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  
  local_24 = 1;
  iVar1 = VP8IteratorIsDone(in_RSI);
  if (iVar1 == 0) {
    do {
      VP8IteratorImport(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      MBAnalyze(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->x,
                (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff98);
      local_24 = VP8IteratorProgress(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      bVar2 = false;
      if (local_24 != 0) {
        iVar1 = VP8IteratorNext((VP8EncIterator *)0x175ca9);
        bVar2 = iVar1 != 0;
      }
    } while (bVar2);
  }
  return local_24;
}

Assistant:

static int DoSegmentsJob(void* arg1, void* arg2) {
  SegmentJob* const job = (SegmentJob*)arg1;
  VP8EncIterator* const it = (VP8EncIterator*)arg2;
  int ok = 1;
  if (!VP8IteratorIsDone(it)) {
    uint8_t tmp[32 + WEBP_ALIGN_CST];
    uint8_t* const scratch = (uint8_t*)WEBP_ALIGN(tmp);
    do {
      // Let's pretend we have perfect lossless reconstruction.
      VP8IteratorImport(it, scratch);
      MBAnalyze(it, job->alphas, &job->alpha, &job->uv_alpha);
      ok = VP8IteratorProgress(it, job->delta_progress);
    } while (ok && VP8IteratorNext(it));
  }
  return ok;
}